

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void percent_rankValueFunc(sqlite3_context *pCtx)

{
  long *plVar1;
  double rVal;
  
  plVar1 = (long *)sqlite3_aggregate_context(pCtx,0x18);
  if (plVar1 != (long *)0x0) {
    *plVar1 = plVar1[1];
    if (plVar1[2] < 2) {
      rVal = 0.0;
    }
    else {
      rVal = (double)plVar1[1] / (double)(plVar1[2] + -1);
    }
    sqlite3_result_double(pCtx,rVal);
    return;
  }
  return;
}

Assistant:

static void percent_rankValueFunc(sqlite3_context *pCtx){
  struct CallCount *p;
  p = (struct CallCount*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    p->nValue = p->nStep;
    if( p->nTotal>1 ){
      double r = (double)p->nValue / (double)(p->nTotal-1);
      sqlite3_result_double(pCtx, r);
    }else{
      sqlite3_result_double(pCtx, 0.0);
    }
  }
}